

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.hpp
# Opt level: O0

ssize_t __thiscall Excel::Record::read(Record *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  int __fd_00;
  undefined8 uVar2;
  size_type sVar3;
  void *__buf_00;
  ssize_t extraout_RAX;
  uint uVar5;
  undefined4 in_register_00000034;
  Exception *anon_var_0_1;
  uint16_t i_1;
  Exception *anon_var_0;
  size_t i;
  vector<char,_std::allocator<char>_> data;
  uint16_t nextRecordLength;
  uint16_t nextRecordCode;
  value_type *in_stack_fffffffffffffee8;
  vector<char,_std::allocator<char>_> *pvVar6;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  RecordSubstream *this_00;
  wstring *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined6 in_stack_ffffffffffffff18;
  byte in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  uint *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  allocator in_stack_ffffffffffffff57;
  wstring local_a8 [33];
  undefined1 local_87;
  ushort local_86;
  uint32_t local_84;
  undefined1 local_72;
  allocator local_71;
  wstring local_70 [39];
  undefined1 local_49;
  ulong local_48;
  vector<char,_std::allocator<char>_> local_30;
  ushort local_14;
  short local_12;
  long *local_10;
  Record *local_8;
  reference pvVar4;
  
  local_10 = (long *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  Stream::read<unsigned_short>
            ((Stream *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
             (unsigned_short *)in_stack_ffffffffffffff48,(int32_t)((ulong)this >> 0x20));
  Stream::read<unsigned_int>
            ((Stream *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
             in_stack_ffffffffffffff48,(int32_t)((ulong)this >> 0x20));
  local_12 = 0;
  local_14 = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x110552);
  if (this->m_length != 0) {
    std::vector<char,_std::allocator<char>_>::reserve
              (in_stack_ffffffffffffff20,
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)));
    for (local_48 = 0; __nbytes = (size_t)this->m_length, local_48 < __nbytes;
        local_48 = local_48 + 1) {
      local_49 = (**(code **)(*local_10 + 0x10))();
      std::vector<char,_std::allocator<char>_>::push_back
                (in_stack_fffffffffffffef0,(value_type_conflict1 *)in_stack_fffffffffffffee8);
      bVar1 = (**(code **)(*local_10 + 0x18))();
      if ((bVar1 & 1) != 0) {
        local_72 = 1;
        uVar2 = __cxa_allocate_exception(0x30);
        std::allocator<wchar_t>::allocator();
        std::__cxx11::wstring::wstring(local_70,L"Unexpected end of file.",&local_71);
        Exception::Exception
                  ((Exception *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8);
        local_72 = 0;
        __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
      }
    }
  }
  Stream::read<unsigned_short>
            ((Stream *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
             (unsigned_short *)in_stack_ffffffffffffff48,(int32_t)((ulong)this >> 0x20));
  do {
    if (local_12 != 0x3c) {
      bVar1 = (**(code **)(*local_10 + 0x18))();
      if ((bVar1 & 1) == 0) {
        (**(code **)(*local_10 + 0x20))(local_10,0xfffffffe,1);
      }
      sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_30);
      if (sVar3 != 0) {
        this_00 = &this->m_stream;
        pvVar6 = &local_30;
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](pvVar6,0);
        __fd_00 = (int)pvVar4;
        __buf_00 = (void *)std::vector<char,_std::allocator<char>_>::size(pvVar6);
        RecordSubstream::write(this_00,__fd_00,__buf_00,__nbytes);
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)CONCAT17(bVar1,in_stack_ffffffffffffff00));
      return extraout_RAX;
    }
    local_84 = this->m_length;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
    Stream::read<unsigned_short>
              ((Stream *)
               CONCAT17(in_stack_ffffffffffffff57,
                        CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
               (unsigned_short *)in_stack_ffffffffffffff48,(int32_t)((ulong)this >> 0x20));
    pvVar6 = &local_30;
    std::vector<char,_std::allocator<char>_>::size(pvVar6);
    std::vector<char,_std::allocator<char>_>::reserve
              (pvVar6,CONCAT17(in_stack_ffffffffffffff1f,
                               CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)));
    if (local_14 != 0) {
      for (local_86 = 0; local_86 < local_14; local_86 = local_86 + 1) {
        in_stack_ffffffffffffff1f = (**(code **)(*local_10 + 0x10))();
        local_87 = in_stack_ffffffffffffff1f;
        std::vector<char,_std::allocator<char>_>::push_back
                  (in_stack_fffffffffffffef0,(value_type_conflict1 *)in_stack_fffffffffffffee8);
        in_stack_ffffffffffffff1e = (**(code **)(*local_10 + 0x18))();
        if ((in_stack_ffffffffffffff1e & 1) != 0) {
          uVar2 = __cxa_allocate_exception(0x30);
          std::allocator<wchar_t>::allocator();
          std::__cxx11::wstring::wstring
                    (local_a8,L"Unexpected end of file.",(allocator *)&stack0xffffffffffffff57);
          Exception::Exception
                    ((Exception *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffef8);
          __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
        }
      }
    }
    uVar5 = this->m_length + (uint)local_14;
    __nbytes = (size_t)uVar5;
    this->m_length = uVar5;
    Stream::read<unsigned_short>
              ((Stream *)
               CONCAT17(in_stack_ffffffffffffff57,
                        CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
               (unsigned_short *)in_stack_ffffffffffffff48,(int32_t)((ulong)this >> 0x20));
  } while( true );
}

Assistant:

inline void
Record::read( Stream & stream )
{
	stream.read( m_code, 2 );
	stream.read( m_length, 2 );

	uint16_t nextRecordCode = 0;
	uint16_t nextRecordLength = 0;

	std::vector< char > data;

	if( m_length )
	{
		data.reserve( m_length );

		for( size_t i = 0; i < m_length; ++i )
		{
			data.push_back( stream.getByte() );

			if( stream.eof() )
				throw Exception( L"Unexpected end of file." );
		}
	}

	try {
		stream.read( nextRecordCode, 2 );
	}
	catch( const Exception & )
	{
		nextRecordCode = XL_UNKNOWN;
	}

	while( nextRecordCode == XL_CONTINUE )
	{
		m_borders.push_back( m_length );

		stream.read( nextRecordLength, 2 );

		data.reserve( data.size() + nextRecordLength );

		if( nextRecordLength )
		{
			for( uint16_t i = 0; i < nextRecordLength; ++i )
			{
				data.push_back( stream.getByte() );

				if( stream.eof() )
					throw Exception( L"Unexpected end of file." );
			}
		}

		m_length += nextRecordLength;

		try {
			stream.read( nextRecordCode, 2 );
		}
		catch( const Exception & )
		{
			nextRecordCode = XL_UNKNOWN;
		}
	}

	if( !stream.eof() )
		stream.seek( -2, Stream::FromCurrent );

	if( data.size() )
		m_stream.write( &data[ 0 ], data.size() );
}